

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O3

int tnt_reply_body0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  byte bVar1;
  bool bVar2;
  size_t *psVar3;
  size_t *psVar4;
  size_t *psVar5;
  int iVar6;
  size_t *psVar7;
  size_t *psVar8;
  size_t *psVar9;
  size_t *psVar10;
  size_t *psVar11;
  ulong uVar12;
  long lVar13;
  size_t size_00;
  size_t *end;
  int64_t iVar14;
  tnt_reply *r_00;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int8_t *piVar18;
  size_t *psStack_e0;
  size_t *psStack_d8;
  size_t sStack_c8;
  size_t sStack_c0;
  size_t *psStack_b8;
  size_t *psStack_b0;
  tnt_reply *ptStack_a8;
  code *pcStack_a0;
  char *local_98;
  char *test;
  tnt_reply *local_88;
  char *local_80;
  size_t *local_78;
  size_t *local_70;
  size_t *local_68;
  size_t *local_60;
  size_t *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  size_t *local_38;
  
  end = (size_t *)(buf + size);
  pcStack_a0 = (code *)0x10ab24;
  psVar9 = off;
  local_98 = buf;
  iVar6 = mp_check(&local_98,(char *)end);
  r_00 = (tnt_reply *)0xffffffff;
  if ((iVar6 == 0) && (bVar1 = *buf, mp_type_hint[bVar1] == MP_MAP)) {
    local_38 = (size_t *)(buf + 1);
    if (bVar1 == 0xdf) {
      uVar15 = *(uint *)(buf + 1);
      uVar16 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                      uVar15 << 0x18);
      local_38 = (size_t *)(buf + 5);
    }
    else if (bVar1 == 0xde) {
      local_38 = (size_t *)(buf + 3);
      uVar16 = (ulong)(ushort)(*(ushort *)(buf + 1) << 8 | *(ushort *)(buf + 1) >> 8);
    }
    else {
      piVar18 = (int8_t *)r;
      if (-0x71 < (char)bVar1) {
LAB_0010b08a:
        pcStack_a0 = tnt_reply;
        tnt_reply_body0_cold_3();
        psStack_b8 = off;
        psStack_b0 = (size_t *)buf;
        ptStack_a8 = (tnt_reply *)piVar18;
        pcStack_a0 = (code *)&stack0xfffffffffffffff8;
        iVar6 = tnt_reply_len((char *)end,size_00,&sStack_c0);
        sStack_c8 = sStack_c0;
        if (iVar6 == 0) {
          if (r_00 == (tnt_reply *)0x0) {
            iVar6 = 0;
          }
          else {
            psStack_d8 = &sStack_c8;
            sStack_c8 = 0;
            psStack_e0 = end;
            iVar6 = tnt_reply_from(r_00,tnt_reply_cb,&psStack_e0);
          }
        }
        else {
          if (iVar6 != 1) {
            return -1;
          }
          iVar6 = 1;
        }
        if (psVar9 != (size_t *)0x0) {
          *psVar9 = sStack_c8;
        }
        return iVar6;
      }
      uVar16 = (ulong)(bVar1 & 0xf);
    }
    test = (char *)off;
    local_88 = r;
    local_80 = buf;
    if ((int)uVar16 == 0) {
      end = (size_t *)0x0;
      local_78 = (size_t *)0x0;
      local_70 = (size_t *)0x0;
      psVar10 = (size_t *)0x0;
      local_68 = (size_t *)0x0;
      psVar11 = (size_t *)0x0;
      local_60 = (size_t *)0x0;
      psVar8 = (size_t *)0x0;
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      piVar18 = "";
      psVar8 = (size_t *)0x0;
      local_60 = (size_t *)0x0;
      psVar11 = (size_t *)0x0;
      local_68 = (size_t *)0x0;
      psVar10 = (size_t *)0x0;
      local_70 = (size_t *)0x0;
      local_78 = (size_t *)0x0;
      end = (size_t *)0x0;
      do {
        r_00 = (tnt_reply *)0xffffffff;
        bVar1 = (byte)*local_38;
        uVar12 = (ulong)bVar1;
        psVar7 = (size_t *)((long)local_38 + 1);
        psVar9 = (size_t *)(ulong)(bVar1 - 0xcc);
        switch(psVar9) {
        case (size_t *)0x0:
          uVar12 = (ulong)*(byte *)((long)local_38 + 1);
          psVar7 = (size_t *)((long)local_38 + 2);
          break;
        case (size_t *)0x1:
          psVar7 = (size_t *)((long)local_38 + 3);
          uVar12 = (ulong)(ushort)(*(ushort *)((long)local_38 + 1) << 8 |
                                  *(ushort *)((long)local_38 + 1) >> 8);
          break;
        case (size_t *)0x2:
          uVar15 = *(uint *)((long)local_38 + 1);
          uVar12 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                          uVar15 << 0x18);
          psVar7 = (size_t *)((long)local_38 + 5);
          break;
        case (size_t *)0x3:
          uVar12 = *(ulong *)((long)local_38 + 1);
          uVar12 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                   (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
          psVar7 = (size_t *)((long)local_38 + 9);
          break;
        default:
          if (-1 < (char)bVar1) break;
          pcStack_a0 = (code *)0x10b085;
          local_38 = psVar7;
          tnt_reply_body0_cold_2();
          goto LAB_0010b085;
        }
        iVar6 = (int)uVar12;
        local_38 = psVar7;
        psVar3 = local_70;
        psVar4 = local_68;
        psVar5 = local_60;
        if (iVar6 < 0x32) {
          if (iVar6 == 0x30) {
            if (mp_type_hint[(byte)*psVar7] != MP_ARRAY) goto LAB_0010b06f;
            iVar14 = 1;
            do {
              psVar10 = (size_t *)((long)local_38 + 1);
              lVar13 = (long)""[(byte)*local_38];
              psVar3 = psVar7;
              if (lVar13 < 0) {
                if ((byte)*local_38 == 0xd9) {
                  psVar10 = (size_t *)((long)local_38 + (ulong)*(byte *)((long)local_38 + 1) + 2);
                }
                else {
                  if ((byte)""[(byte)*local_38] < 0xe1) {
                    pcStack_a0 = (code *)0x10afac;
                    local_58 = end;
                    local_50 = uVar12;
                    local_48 = uVar16;
                    local_40 = uVar17;
                    mp_next_slowpath((char **)&local_38,iVar14);
                    uVar12 = local_50;
                    end = local_58;
                    uVar16 = local_48;
                    uVar17 = local_40;
                    psVar10 = local_38;
                    psVar4 = local_68;
                    psVar5 = local_60;
                    break;
                  }
                  iVar14 = iVar14 - lVar13;
                  local_48 = uVar16;
                  local_40 = uVar17;
                }
              }
              else {
                psVar10 = (size_t *)((long)psVar10 + lVar13);
              }
              bVar2 = 1 < iVar14;
              iVar14 = iVar14 + -1;
              local_38 = psVar10;
              local_58 = end;
              local_50 = uVar12;
            } while (bVar2);
          }
          else if (iVar6 == 0x31) {
            bVar1 = (byte)*psVar7;
            if (mp_type_hint[bVar1] != MP_STR) goto LAB_0010b06f;
            end = (size_t *)((long)psVar7 + 1);
            if (bVar1 == 0xdb) {
              uVar15 = *(uint *)((long)psVar7 + 1);
              uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                       uVar15 << 0x18;
              end = (size_t *)((long)psVar7 + 5);
            }
            else if (bVar1 == 0xda) {
              end = (size_t *)((long)psVar7 + 3);
              uVar15 = (uint)(ushort)(*(ushort *)((long)psVar7 + 1) << 8 |
                                     *(ushort *)((long)psVar7 + 1) >> 8);
            }
            else if (bVar1 == 0xd9) {
              uVar15 = (uint)*(byte *)((long)psVar7 + 1);
              end = (size_t *)((long)psVar7 + 2);
            }
            else {
              psVar9 = (size_t *)(ulong)(bVar1 + 0x40);
              local_38 = end;
              if ((byte)(bVar1 + 0x40) < 0xe0) {
LAB_0010b085:
                pcStack_a0 = (code *)0x10b08a;
                tnt_reply_body0_cold_1();
                off = psVar8;
                buf = (char *)psVar11;
                goto LAB_0010b08a;
              }
              uVar15 = bVar1 & 0x1f;
            }
            local_78 = (size_t *)((ulong)uVar15 + (long)end);
            local_38 = local_78;
          }
          else {
LAB_0010ad5b:
            iVar14 = 1;
            do {
              psVar9 = (size_t *)((long)local_38 + 1);
              lVar13 = (long)""[(byte)*local_38];
              if (lVar13 < 0) {
                if ((byte)*local_38 == 0xd9) {
                  psVar9 = (size_t *)((long)local_38 + (ulong)*(byte *)((long)local_38 + 1) + 2);
                }
                else {
                  if ((byte)""[(byte)*local_38] < 0xe1) {
                    pcStack_a0 = (code *)0x10af7c;
                    local_58 = end;
                    local_50 = uVar12;
                    local_48 = uVar16;
                    local_40 = uVar17;
                    mp_next_slowpath((char **)&local_38,iVar14);
                    uVar12 = local_50;
                    end = local_58;
                    uVar16 = local_48;
                    uVar17 = local_40;
                    psVar3 = local_70;
                    psVar4 = local_68;
                    psVar5 = local_60;
                    break;
                  }
                  iVar14 = iVar14 - lVar13;
                  local_48 = uVar16;
                  local_40 = uVar17;
                }
              }
              else {
                psVar9 = (size_t *)((long)psVar9 + lVar13);
              }
              bVar2 = 1 < iVar14;
              iVar14 = iVar14 + -1;
              local_38 = psVar9;
              local_58 = end;
              local_50 = uVar12;
            } while (bVar2);
          }
        }
        else if (iVar6 == 0x32) {
          if (mp_type_hint[(byte)*psVar7] != MP_ARRAY) goto LAB_0010b06f;
          iVar14 = 1;
          do {
            psVar11 = (size_t *)((long)local_38 + 1);
            lVar13 = (long)""[(byte)*local_38];
            psVar4 = psVar7;
            if (lVar13 < 0) {
              if ((byte)*local_38 == 0xd9) {
                psVar11 = (size_t *)((long)local_38 + (ulong)*(byte *)((long)local_38 + 1) + 2);
              }
              else {
                if ((byte)""[(byte)*local_38] < 0xe1) {
                  pcStack_a0 = (code *)0x10afc8;
                  local_58 = end;
                  local_50 = uVar12;
                  local_48 = uVar16;
                  local_40 = uVar17;
                  mp_next_slowpath((char **)&local_38,iVar14);
                  uVar12 = local_50;
                  end = local_58;
                  uVar16 = local_48;
                  uVar17 = local_40;
                  psVar11 = local_38;
                  psVar3 = local_70;
                  psVar5 = local_60;
                  break;
                }
                iVar14 = iVar14 - lVar13;
                local_48 = uVar16;
                local_40 = uVar17;
              }
            }
            else {
              psVar11 = (size_t *)((long)psVar11 + lVar13);
            }
            bVar2 = 1 < iVar14;
            iVar14 = iVar14 + -1;
            local_38 = psVar11;
            local_58 = end;
            local_50 = uVar12;
          } while (bVar2);
        }
        else {
          if (iVar6 != 0x42) goto LAB_0010ad5b;
          if (mp_type_hint[(byte)*psVar7] != MP_MAP) goto LAB_0010b06f;
          iVar14 = 1;
          do {
            psVar8 = (size_t *)((long)local_38 + 1);
            lVar13 = (long)""[(byte)*local_38];
            psVar5 = psVar7;
            if (lVar13 < 0) {
              if ((byte)*local_38 == 0xd9) {
                psVar8 = (size_t *)((long)local_38 + (ulong)*(byte *)((long)local_38 + 1) + 2);
              }
              else {
                if ((byte)""[(byte)*local_38] < 0xe1) {
                  pcStack_a0 = (code *)0x10af90;
                  local_58 = end;
                  local_50 = uVar12;
                  local_48 = uVar16;
                  local_40 = uVar17;
                  mp_next_slowpath((char **)&local_38,iVar14);
                  uVar12 = local_50;
                  psVar8 = local_38;
                  end = local_58;
                  uVar16 = local_48;
                  uVar17 = local_40;
                  psVar3 = local_70;
                  psVar4 = local_68;
                  break;
                }
                iVar14 = iVar14 - lVar13;
                local_48 = uVar16;
                local_40 = uVar17;
              }
            }
            else {
              psVar8 = (size_t *)((long)psVar8 + lVar13);
            }
            bVar2 = 1 < iVar14;
            local_38 = psVar8;
            iVar14 = iVar14 + -1;
            local_58 = end;
            local_50 = uVar12;
          } while (bVar2);
        }
        local_60 = psVar5;
        local_68 = psVar4;
        local_70 = psVar3;
        uVar15 = (int)uVar16 - 1;
        uVar16 = (ulong)uVar15;
        uVar17 = uVar17 | 1L << (uVar12 & 0x3f);
      } while (uVar15 != 0);
    }
    if (local_88 != (tnt_reply *)0x0) {
      local_88->error = (char *)end;
      local_88->error_end = (char *)local_78;
      local_88->data = (char *)local_70;
      local_88->data_end = (char *)psVar10;
      local_88->metadata = (char *)local_68;
      local_88->metadata_end = (char *)psVar11;
      local_88->sqlinfo = (char *)local_60;
      local_88->sqlinfo_end = (char *)psVar8;
      local_88->bitmap = local_88->bitmap | uVar17;
    }
    r_00 = (tnt_reply *)0x0;
    if (test != (char *)0x0) {
      *(long *)test = (long)local_38 - (long)local_80;
    }
  }
LAB_0010b06f:
  return (int)r_00;
}

Assistant:

int
tnt_reply_body0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	const char *test = buf;
	const char *p = buf;
	if (mp_check(&test, p + size))
		return -1;
	if (mp_typeof(*p) != MP_MAP)
		return -1;
	const char *error = NULL, *error_end = NULL,
		   *data = NULL, *data_end = NULL,
		   *metadata = NULL, *metadata_end = NULL,
		   *sqlinfo = NULL, *sqlinfo_end = NULL;
	uint64_t bitmap = 0;
	uint32_t n = mp_decode_map(&p);
	while (n-- > 0) {
		uint32_t key = mp_decode_uint(&p);
		switch (key) {
		case TNT_ERROR: {
			if (mp_typeof(*p) != MP_STR)
				return -1;
			uint32_t elen = 0;
			error = mp_decode_str(&p, &elen);
			error_end = error + elen;
			break;
		}
		case TNT_DATA: {
			if (mp_typeof(*p) != MP_ARRAY)
				return -1;
			data = p;
			mp_next(&p);
			data_end = p;
			break;
		}
		case TNT_METADATA: {
			if (mp_typeof(*p) != MP_ARRAY)
				return -1;
			metadata = p;
			mp_next(&p);
			metadata_end = p;
			break;
		}
		case TNT_SQL_INFO: {
			if (mp_typeof(*p) != MP_MAP)
				return -1;
			sqlinfo = p;
			mp_next(&p);
			sqlinfo_end = p;
			break;
		}
		default: {
			mp_next(&p);
			break;
		}
		}
		bitmap |= (1ULL << key);
	}
	if (r) {
		r->error = error;
		r->error_end = error_end;
		r->data = data;
		r->data_end = data_end;
		r->metadata = metadata;
		r->metadata_end = metadata_end;
		r->sqlinfo = sqlinfo;
		r->sqlinfo_end = sqlinfo_end;
		r->bitmap |= bitmap;
	}
	if (off)
		*off = p - buf;
	return 0;
}